

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_2cdd::GetSpectralEnvelope
               (double current_time,double frame_period,int f0_length,double **spectrogram,
               int fft_size,double *spectral_envelope)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int local_50;
  int local_4c;
  int i_1;
  int i;
  double interpolation;
  int current_frame_ceil;
  int current_frame_floor;
  double *spectral_envelope_local;
  int fft_size_local;
  double **spectrogram_local;
  int f0_length_local;
  double frame_period_local;
  double current_time_local;
  
  dVar3 = floor(current_time / frame_period);
  iVar1 = MyMinInt(f0_length + -1,(int)dVar3);
  dVar3 = ceil(current_time / frame_period);
  iVar2 = MyMinInt(f0_length + -1,(int)dVar3);
  dVar3 = current_time / frame_period - (double)iVar1;
  if (iVar1 == iVar2) {
    for (local_4c = 0; local_4c <= fft_size / 2; local_4c = local_4c + 1) {
      spectral_envelope[local_4c] = ABS(spectrogram[iVar1][local_4c]);
    }
  }
  else {
    for (local_50 = 0; local_50 <= fft_size / 2; local_50 = local_50 + 1) {
      spectral_envelope[local_50] =
           (1.0 - dVar3) * ABS(spectrogram[iVar1][local_50]) +
           dVar3 * ABS(spectrogram[iVar2][local_50]);
    }
  }
  return;
}

Assistant:

static void GetSpectralEnvelope(double current_time, double frame_period,
    int f0_length, const double * const *spectrogram, int fft_size,
    double *spectral_envelope) {
  int current_frame_floor = MyMinInt(f0_length - 1,
    static_cast<int>(floor(current_time / frame_period)));
  int current_frame_ceil = MyMinInt(f0_length - 1,
    static_cast<int>(ceil(current_time / frame_period)));
  double interpolation = current_time / frame_period - current_frame_floor;

  if (current_frame_floor == current_frame_ceil)
    for (int i = 0; i <= fft_size / 2; ++i)
      spectral_envelope[i] = fabs(spectrogram[current_frame_floor][i]);
  else
    for (int i = 0; i <= fft_size / 2; ++i)
      spectral_envelope[i] =
        (1.0 - interpolation) * fabs(spectrogram[current_frame_floor][i]) +
        interpolation * fabs(spectrogram[current_frame_ceil][i]);
}